

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_properties(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlChar *local_48;
  xmlAttrPtr local_40;
  xmlAttrPtr res;
  xmlNodePtr cur;
  PyObject *obj;
  PyObject *resultobj;
  PyObject *args_local;
  PyObject *self_local;
  
  resultobj = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:properties",&cur);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (cur == (xmlNodePtr)&_Py_NoneStruct) {
      local_48 = (xmlChar *)0x0;
    }
    else {
      local_48 = cur->name;
    }
    if ((local_48 == (xmlChar *)0x0) || (*(int *)(local_48 + 8) != 1)) {
      local_40 = (xmlAttrPtr)0x0;
    }
    else {
      local_40 = *(xmlAttrPtr *)(local_48 + 0x58);
    }
    self_local = libxml_xmlAttrPtrWrap(local_40);
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_properties(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *resultobj, *obj;
    xmlNodePtr cur;
    xmlAttrPtr res;

    if (!PyArg_ParseTuple(args, (char *) "O:properties", &obj))
        return NULL;
    cur = PyxmlNode_Get(obj);
    if ((cur != NULL) && (cur->type == XML_ELEMENT_NODE))
        res = cur->properties;
    else
        res = NULL;
    resultobj = libxml_xmlAttrPtrWrap(res);
    return resultobj;
}